

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

ByteData256 * __thiscall
cfd::core::ConfidentialTransaction::GetElementsSignatureHash
          (ByteData256 *__return_storage_ptr__,ConfidentialTransaction *this,uint32_t txin_index,
          ByteData *script_data,SigHashType *sighash_type,ConfidentialValue *value,
          WitnessVersion version)

{
  wally_tx *tx;
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  uchar *puVar4;
  size_type sVar5;
  undefined8 uVar6;
  ulong index;
  uchar *value_00;
  size_type value_len;
  uchar *bytes_out;
  string *message;
  string *in_stack_fffffffffffffd00;
  size_type in_stack_fffffffffffffd08;
  CfdError CVar7;
  CfdException *in_stack_fffffffffffffd10;
  CfdException *this_00;
  undefined1 local_219 [33];
  CfdSourceLocation local_1f8 [3];
  uint local_19c;
  undefined1 local_198 [4];
  uint32_t tx_flag;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_180;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_168;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *value_data;
  string local_158 [32];
  CfdSourceLocation local_138;
  ByteData local_120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *tx_bytedata;
  wally_tx *pwStack_e0;
  int ret;
  wally_tx *tx_pointer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes;
  undefined1 local_b0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  allocator local_81;
  string local_80 [32];
  CfdSourceLocation local_60;
  ConfidentialValue *local_48;
  ConfidentialValue *value_local;
  SigHashType *sighash_type_local;
  ByteData *script_data_local;
  ConfidentialTransaction *pCStack_28;
  uint32_t txin_index_local;
  ConfidentialTransaction *this_local;
  
  local_48 = value;
  value_local = (ConfidentialValue *)sighash_type;
  sighash_type_local = (SigHashType *)script_data;
  script_data_local._4_4_ = txin_index;
  pCStack_28 = this;
  this_local = (ConfidentialTransaction *)__return_storage_ptr__;
  bVar1 = ByteData::IsEmpty(script_data);
  if (bVar1) {
    local_60.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    CVar7 = (CfdError)(in_stack_fffffffffffffd08 >> 0x20);
    local_60.filename = local_60.filename + 1;
    local_60.line = 0xbed;
    local_60.funcname = "GetElementsSignatureHash";
    logger::warn<>(&local_60,"empty script");
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    uVar6 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_80,"Failed to GetSignatureHash. empty script.",&local_81);
    CfdException::CfdException(in_stack_fffffffffffffd10,CVar7,in_stack_fffffffffffffd00);
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    __cxa_throw(uVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4bb55c);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd10,
             in_stack_fffffffffffffd08,(allocator_type *)in_stack_fffffffffffffd00);
  CVar7 = (CfdError)(in_stack_fffffffffffffd08 >> 0x20);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4bb582);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx_pointer,
                     (ByteData *)sighash_type_local);
  local_c0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx_pointer;
  pwStack_e0 = (wally_tx *)0x0;
  uVar2 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[7])();
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xd])
            (&local_120,this,(ulong)(uVar2 & 1));
  ByteData::GetBytes(&local_108,&local_120);
  ByteData::~ByteData((ByteData *)0x4bb60b);
  local_f0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108;
  puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_f0);
  sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_f0);
  uVar3 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[9])();
  tx_bytedata._4_4_ = wally_tx_from_bytes(puVar4,sVar5,uVar3,&stack0xffffffffffffff20);
  if ((tx_bytedata._4_4_ == 0) && (pwStack_e0 != (wally_tx *)0x0)) {
    ConfidentialValue::GetData((ByteData *)local_198,local_48);
    ByteData::GetBytes(&local_180,(ByteData *)local_198);
    ByteData::~ByteData((ByteData *)0x4bb890);
    local_168 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_180;
    local_19c = 0;
    if (version != kVersionNone) {
      local_19c = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[9])();
      local_19c = local_19c & 1;
    }
    tx = pwStack_e0;
    index = (ulong)script_data_local._4_4_;
    puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_c0);
    sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_c0);
    value_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_168);
    value_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_168);
    uVar3 = SigHashType::GetSigHashFlag(sighash_type);
    uVar2 = local_19c;
    bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4bbab7);
    message = (string *)
              ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0);
    tx_bytedata._4_4_ =
         wally_tx_get_elements_signature_hash
                   (tx,index,puVar4,sVar5,value_00,value_len,uVar3,uVar2,bytes_out,(size_t)message);
    wally_tx_free(pwStack_e0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    if (tx_bytedata._4_4_ != 0) {
      local_1f8[0].filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                   ,0x2f);
      local_1f8[0].filename = local_1f8[0].filename + 1;
      local_1f8[0].line = 0xc16;
      local_1f8[0].funcname = "GetElementsSignatureHash";
      logger::warn<int&>(local_1f8,"wally_tx_get_elements_signature_hash NG[{}] ",
                         (int *)((long)&tx_bytedata + 4));
      uVar6 = __cxa_allocate_exception(0x30);
      this_00 = (CfdException *)local_219;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)(local_219 + 1),"SignatureHash generate error.",(allocator *)this_00);
      CfdException::CfdException(this_00,(CfdError)((ulong)uVar6 >> 0x20),message);
      __cxa_throw(uVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData256::ByteData256
              (__return_storage_ptr__,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    return __return_storage_ptr__;
  }
  local_138.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
               ,0x2f);
  local_138.filename = local_138.filename + 1;
  local_138.line = 0xbfc;
  local_138.funcname = "GetElementsSignatureHash";
  logger::warn<int&>(&local_138,"wally_tx_from_bytes NG[{}] ",(int *)((long)&tx_bytedata + 4));
  value_data._6_1_ = 1;
  uVar6 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_158,"transaction data invalid.",(allocator *)((long)&value_data + 7));
  CfdException::CfdException(in_stack_fffffffffffffd10,CVar7,in_stack_fffffffffffffd00);
  value_data._6_1_ = 0;
  __cxa_throw(uVar6,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData256 ConfidentialTransaction::GetElementsSignatureHash(
    uint32_t txin_index, const ByteData &script_data, SigHashType sighash_type,
    const ConfidentialValue &value, WitnessVersion version) const {
  if (script_data.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "empty script");
    throw CfdException(
        kCfdIllegalArgumentError, "Failed to GetSignatureHash. empty script.");
  }
  std::vector<uint8_t> buffer(SHA256_LEN);
  const std::vector<uint8_t> &bytes = script_data.GetBytes();
  struct wally_tx *tx_pointer = NULL;
  int ret;

  // Change AbstractTransaction to wally_tx
  const std::vector<uint8_t> &tx_bytedata =
      GetByteData(HasWitness()).GetBytes();
  ret = wally_tx_from_bytes(
      tx_bytedata.data(), tx_bytedata.size(), GetWallyFlag(), &tx_pointer);
  if (ret != WALLY_OK || tx_pointer == NULL) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_bytes NG[{}] ", ret);
    throw CfdException(kCfdIllegalArgumentError, "transaction data invalid.");
  }

  // Calculate signature hash
  try {
    const std::vector<uint8_t> &value_data = value.GetData().GetBytes();
    uint32_t tx_flag = 0;
    if (version != WitnessVersion::kVersionNone) {
      tx_flag = GetWallyFlag() & WALLY_TX_FLAG_USE_WITNESS;
    }
    ret = wally_tx_get_elements_signature_hash(
        tx_pointer, txin_index, bytes.data(), bytes.size(), value_data.data(),
        value_data.size(), sighash_type.GetSigHashFlag(), tx_flag,
        buffer.data(), buffer.size());
    wally_tx_free(tx_pointer);
  } catch (...) {
    wally_tx_free(tx_pointer);
    warn(
        CFD_LOG_SOURCE, "wally_tx_get_elements_signature_hash exception[{}] ",
        ret);
    throw CfdException(
        kCfdIllegalArgumentError, "SignatureHash generate error.");
  }

  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_elements_signature_hash NG[{}] ", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "SignatureHash generate error.");
  }
  return ByteData256(buffer);
}